

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e304c3::AV1Convolve2DHighbdTest_RunTest_Test::TestBody
          (AV1Convolve2DHighbdTest_RunTest_Test *this)

{
  AV1Convolve2DHighbdTest *in_stack_00000010;
  
  AV1Convolve2DHighbdTest::RunTest(in_stack_00000010);
  return;
}

Assistant:

TEST_P(AV1Convolve2DHighbdTest, RunTest) { RunTest(); }